

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O2

void __thiscall
rr::FragmentProcessor::executeSignedValueWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,BVec4 *colorMask,PixelBufferAccess *colorBuffer)

{
  ulong uVar1;
  int iVar2;
  int y;
  Vector<int,_4> *trueVal;
  ulong uVar3;
  IVec4 originalValue;
  IVec4 local_50;
  Vector<int,_4> local_40;
  
  trueVal = &this->m_sampleRegister[0].signedValue;
  for (uVar3 = 0; uVar3 != 0x40; uVar3 = uVar3 + 1) {
    if (*(char *)((long)(trueVal + -7) + 0xc) == '\x01') {
      uVar1 = (ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff;
      y = (int)((long)uVar1 % (long)numSamplesPerFragment);
      iVar2 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)&local_40,(int)colorBuffer,y,
                 inputFragments[iVar2].pixelCoord.m_data[0]);
      tcu::select<int,4>((tcu *)&local_50,trueVal,&local_40,colorMask);
      tcu::PixelBufferAccess::setPixel
                (colorBuffer,&local_50,y,inputFragments[iVar2].pixelCoord.m_data[0],
                 inputFragments[iVar2].pixelCoord.m_data[1]);
    }
    trueVal = (Vector<int,_4> *)((long)(trueVal + 8) + 4);
  }
  return;
}

Assistant:

void FragmentProcessor::executeSignedValueWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const tcu::BVec4& colorMask, const tcu::PixelBufferAccess& colorBuffer)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			const IVec4			originalValue	= colorBuffer.getPixelInt(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());

			colorBuffer.setPixel(tcu::select(m_sampleRegister[regSampleNdx].signedValue, originalValue, colorMask), fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
		}
	}
}